

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O3

void Abc_NodeConeMarkCollect_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vVisited)

{
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  
  uVar2 = *(uint *)&pNode->field_0x14;
  if ((uVar2 & 0x10) == 0) {
    if ((uVar2 & 0xf) == 7) {
      Abc_NodeConeMarkCollect_rec
                ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vVisited);
      Abc_NodeConeMarkCollect_rec
                ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],vVisited);
      uVar2 = *(uint *)&pNode->field_0x14;
    }
    if ((uVar2 & 0x10) != 0) {
      __assert_fail("pNode->fMarkA == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                    ,0x1e5,"void Abc_NodeConeMarkCollect_rec(Abc_Obj_t *, Vec_Ptr_t *)");
    }
    *(uint *)&pNode->field_0x14 = uVar2 | 0x10;
    uVar2 = vVisited->nSize;
    if (uVar2 == vVisited->nCap) {
      if ((int)uVar2 < 0x10) {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(0x80);
        }
        else {
          ppvVar3 = (void **)realloc(vVisited->pArray,0x80);
        }
        vVisited->pArray = ppvVar3;
        vVisited->nCap = 0x10;
      }
      else {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
        }
        else {
          ppvVar3 = (void **)realloc(vVisited->pArray,(ulong)uVar2 << 4);
        }
        vVisited->pArray = ppvVar3;
        vVisited->nCap = uVar2 * 2;
      }
    }
    else {
      ppvVar3 = vVisited->pArray;
    }
    iVar1 = vVisited->nSize;
    vVisited->nSize = iVar1 + 1;
    ppvVar3[iVar1] = pNode;
  }
  return;
}

Assistant:

void Abc_NodeConeMarkCollect_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vVisited )
{
    if ( pNode->fMarkA == 1 )
        return;
    // visit transitive fanin 
    if ( Abc_ObjIsNode(pNode) )
    {
        Abc_NodeConeMarkCollect_rec( Abc_ObjFanin0(pNode), vVisited );
        Abc_NodeConeMarkCollect_rec( Abc_ObjFanin1(pNode), vVisited );
    }
    assert( pNode->fMarkA == 0 );
    pNode->fMarkA = 1;
    Vec_PtrPush( vVisited, pNode );
}